

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O3

void __thiscall Func::EndPhase(Func *this,Phase tag,bool dump)

{
  uint uVar1;
  undefined8 uVar2;
  code *pcVar3;
  bool bVar4;
  ExecutionMode executionMode;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Func *in_RAX;
  JITTimeFunctionBody *pJVar8;
  FunctionJITTimeInfo *pFVar9;
  char *pcVar10;
  undefined4 *puVar11;
  undefined7 in_register_00000011;
  DbCheckPostLower local_38;
  DbCheckPostLower dbCheck;
  
  local_38.func = in_RAX;
  EndProfiler(this,tag);
  if ((int)CONCAT71(in_register_00000011,dump) != 0) {
    pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
    uVar5 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
    pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->m_workItem);
    uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015962f8,tag,uVar5,uVar6);
    if (!bVar4) {
      pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
      uVar5 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
      pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->m_workItem);
      uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015962f8,BackEndPhase,uVar5,uVar6);
      if (!bVar4) goto LAB_0042881e;
    }
    Output::Print(L"-----------------------------------------------------------------------------\n"
                 );
    bVar4 = JITTimeWorkItem::IsLoopBody(this->m_workItem);
    uVar2 = (&Js::PhaseNames)[tag];
    executionMode = JITTimeWorkItem::GetJitMode(this->m_workItem);
    pcVar10 = ExecutionModeName(executionMode);
    if (bVar4) {
      uVar5 = JITTimeWorkItem::GetLoopNumber(this->m_workItem);
      Output::Print(L"************   IR after %s (%S) Loop %d ************\n",uVar2,pcVar10,
                    (ulong)uVar5);
    }
    else {
      Output::Print(L"************   IR after %s (%S)  ************\n",uVar2,pcVar10);
    }
    Dump(this,(uint)DAT_015932cf);
  }
LAB_0042881e:
  if (tag < PeepsPhase) {
    if (tag == LowererPhase) {
      uVar7 = *(uint *)&this->field_0x240;
      if ((uVar7 >> 0x15 & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                           ,0x534,"(!this->isPostLower)","!this->isPostLower");
        if (!bVar4) goto LAB_00428b04;
        *puVar11 = 0;
        uVar7 = *(uint *)&this->field_0x240;
      }
      *(uint *)&this->field_0x240 = uVar7 | 0x200000;
      local_38.func = this;
      DbCheckPostLower::CheckNestedHelperCalls(&local_38);
      goto LAB_00428a59;
    }
    if (tag != RegAllocPhase) goto LAB_00428a59;
    uVar1 = *(uint *)&this->field_0x240;
    uVar7 = uVar1 | 0x80000;
    *(uint *)&this->field_0x240 = uVar7;
    if ((uVar1 >> 0x16 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x53d,"(!this->isPostRegAlloc)","!this->isPostRegAlloc");
      if (!bVar4) goto LAB_00428b04;
      *puVar11 = 0;
      uVar7 = *(uint *)&this->field_0x240;
    }
    uVar7 = uVar7 | 0x400000;
  }
  else if (tag == PeepsPhase) {
    uVar7 = *(uint *)&this->field_0x240;
    if ((uVar7 & 0x1200000) != 0x200000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x542,"(this->isPostLower && !this->isPostLayout)",
                         "this->isPostLower && !this->isPostLayout");
      if (!bVar4) {
LAB_00428b04:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar11 = 0;
      uVar7 = *(uint *)&this->field_0x240;
    }
    uVar7 = uVar7 | 0x800000;
  }
  else if (tag == LayoutPhase) {
    uVar7 = *(uint *)&this->field_0x240;
    if ((uVar7 & 0x1800000) != 0x800000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x547,"(this->isPostPeeps && !this->isPostLayout)",
                         "this->isPostPeeps && !this->isPostLayout");
      if (!bVar4) goto LAB_00428b04;
      *puVar11 = 0;
      uVar7 = *(uint *)&this->field_0x240;
    }
    uVar7 = uVar7 | 0x1000000;
  }
  else {
    if (tag != FinalLowerPhase) goto LAB_00428a59;
    uVar7 = *(uint *)&this->field_0x240;
    if ((uVar7 & 0x3000000) != 0x1000000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x54c,"(this->isPostLayout && !this->isPostFinalLower)",
                         "this->isPostLayout && !this->isPostFinalLower");
      if (!bVar4) goto LAB_00428b04;
      *puVar11 = 0;
      uVar7 = *(uint *)&this->field_0x240;
    }
    uVar7 = uVar7 | 0x2000000;
  }
  *(uint *)&this->field_0x240 = uVar7;
LAB_00428a59:
  if ((this->field_0x242 & 0x20) != 0) {
    local_38.func = this;
    DbCheckPostLower::Check(&local_38);
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::MergeDelayFreeList
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this->m_alloc);
  return;
}

Assistant:

void
Func::EndPhase(Js::Phase tag, bool dump)
{
    this->EndProfiler(tag);
#if DBG_DUMP
    if(dump && (PHASE_DUMP(tag, this)
        || PHASE_DUMP(Js::BackEndPhase, this)))
    {
        Output::Print(_u("-----------------------------------------------------------------------------\n"));

        if (IsLoopBody())
        {
            Output::Print(_u("************   IR after %s (%S) Loop %d ************\n"),
                Js::PhaseNames[tag],
                ExecutionModeName(m_workItem->GetJitMode()),
                m_workItem->GetLoopNumber());
        }
        else
        {
            Output::Print(_u("************   IR after %s (%S)  ************\n"),
                Js::PhaseNames[tag],
                ExecutionModeName(m_workItem->GetJitMode()));
        }
        this->Dump(Js::Configuration::Global.flags.AsmDiff? IRDumpFlags_AsmDumpMode : IRDumpFlags_None);
    }
#endif

    if (tag == Js::RegAllocPhase)
    {
        this->legalizePostRegAlloc = true;
    }

#if DBG
    if (tag == Js::LowererPhase)
    {
        Assert(!this->isPostLower);
        this->isPostLower = true;
#if !defined(_M_ARM) && !defined(_M_ARM64) // Need to verify ARM is clean.
        DbCheckPostLower dbCheck(this);
        dbCheck.CheckNestedHelperCalls();
#endif
    }
    else if (tag == Js::RegAllocPhase)
    {
        Assert(!this->isPostRegAlloc);
        this->isPostRegAlloc = true;
    }
    else if (tag == Js::PeepsPhase)
    {
        Assert(this->isPostLower && !this->isPostLayout);
        this->isPostPeeps = true;
    }
    else if (tag == Js::LayoutPhase)
    {
        Assert(this->isPostPeeps && !this->isPostLayout);
        this->isPostLayout = true;
    }
    else if (tag == Js::FinalLowerPhase)
    {
        Assert(this->isPostLayout && !this->isPostFinalLower);
        this->isPostFinalLower = true;
    }
    if (this->isPostLower)
    {
#ifndef _M_ARM    // Need to verify ARM is clean.
        DbCheckPostLower dbCheck(this);

        dbCheck.Check();
#endif
    }
    this->m_alloc->MergeDelayFreeList();
#endif
}